

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

bool __thiscall xmrig::OclBackend::isEnabled(OclBackend *this,Algorithm *algorithm)

{
  Config *this_00;
  OclConfig *pOVar1;
  OclThreads *pOVar2;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  pOVar1 = Config::cl(this_00);
  pOVar2 = Threads<xmrig::OclThreads>::get(&pOVar1->m_threads);
  return (pOVar2->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (pOVar2->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool xmrig::OclBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cl().threads().get().isEmpty();
}